

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_sort.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  streamoff sVar5;
  uint *puVar6;
  undefined1 local_480 [8];
  fstream of;
  char local_470 [512];
  uint *local_270;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_268;
  value_type local_25c;
  fpos afStack_258 [4];
  uint32_t x;
  undefined8 local_250;
  undefined1 local_248 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  long local_220;
  ifstream f;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(&local_220,"input",_S_bin);
  std::istream::seekg((long)&local_220,_S_beg);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  _afStack_258 = std::istream::tellg();
  sVar5 = std::fpos::operator_cast_to_long(afStack_258);
  if (sVar5 < 0) {
    sVar5 = sVar5 + 3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248,sVar5 >> 2);
  std::istream::seekg((long)&local_220,_S_beg);
  while( true ) {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    std::istream::read((char *)&local_220,(long)&local_25c);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
    if (bVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248,&local_25c);
    }
  }
  local_268._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  local_270 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_268,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_270);
  pcVar1 = argv[1];
  _Var4 = std::operator|(_S_bin,_S_out);
  std::fstream::fstream(local_480,pcVar1,_Var4);
  puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  std::ostream::write(local_470,(long)puVar6);
  std::fstream::~fstream(local_480);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
  std::ifstream::~ifstream(&local_220);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    ifstream f("input", std::ios::binary);
    f.seekg(0, ios::end);

    vector<uint32_t > arr;
    arr.reserve(f.tellg()/4);

    f.seekg(0, ios::beg);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            arr.push_back(x);
        }

    }
    sort(arr.begin(), arr.end());

    fstream of(argv[1], std::ios::binary|std::ios::out);
    of.write((char*)arr.data(), arr.size()*4);
    return 0;
}